

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_packet.cxx
# Opt level: O0

char * __thiscall xray_re::xr_packet::skip_sz(xr_packet *this)

{
  size_t sVar1;
  size_t sVar2;
  char *p;
  xr_packet *this_local;
  
  sVar1 = this->m_r_pos;
  do {
    if (0xfff < this->m_r_pos) {
      if (this->m_r_pos < 0x1000) {
        return (char *)(this->m_buf + sVar1);
      }
      __assert_fail("m_r_pos < sizeof(m_buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_packet.cxx"
                    ,0x4f,"const char *xray_re::xr_packet::skip_sz()");
    }
    sVar2 = this->m_r_pos;
    this->m_r_pos = sVar2 + 1;
  } while (this->m_buf[sVar2] != '\0');
  return (char *)(this->m_buf + sVar1);
}

Assistant:

const char* xr_packet::skip_sz()
{
	const char* p = reinterpret_cast<const char*>(m_buf + m_r_pos);
	while (m_r_pos < sizeof(m_buf)) {
		if (m_buf[m_r_pos++] == 0)
			return p;
	}
	// crash in debug mode if no 0 in the packet
	xr_assert(m_r_pos < sizeof(m_buf));
	return p;
}